

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall duckdb_re2::DFA::AddToQueue(DFA *this,Workq *q,int id,uint32_t flag)

{
  int *piVar1;
  Prog *pPVar2;
  Inst *pIVar3;
  bool bVar4;
  uint uVar5;
  uint i;
  ostream *this_00;
  int iVar6;
  ulong uVar7;
  ostringstream local_1a8 [376];
  
  piVar1 = (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
           _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  *piVar1 = id;
  uVar7 = 1;
LAB_01ec89a9:
  if ((int)uVar7 < 1) {
    return;
  }
  uVar7 = (ulong)((int)uVar7 - 1);
  i = piVar1[uVar7];
LAB_01ec89bc:
  do {
    if (i == 0) goto LAB_01ec89a9;
    if (i == 0xffffffff) {
      Workq::mark(q);
      goto LAB_01ec89a9;
    }
    bVar4 = SparseSetT<void>::contains(&q->super_SparseSet,i);
    if (bVar4) goto LAB_01ec89a9;
    Workq::insert_new(q,i);
    pPVar2 = this->prog_;
    pIVar3 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
             ((long)&(pPVar2->inst_).ptr_._M_t.
                     super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             + 8))->_M_head_impl;
    uVar5 = pIVar3[(int)i].out_opcode_;
    if (5 < (uVar5 & 7) - 1) {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      this_00 = std::operator<<((ostream *)local_1a8,"unhandled opcode: ");
      std::ostream::operator<<(this_00,pIVar3[(int)i].out_opcode_ & 7);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      goto LAB_01ec89a9;
    }
    iVar6 = (int)uVar7;
    switch(uVar5 & 7) {
    case 1:
      i = i + 1;
      goto LAB_01ec89bc;
    default:
      goto switchD_01ec8a0e_caseD_2;
    case 3:
    case 6:
      if ((uVar5 & 8) == 0) {
        uVar7 = (ulong)(iVar6 + 1);
        piVar1[iVar6] = i + 1;
        uVar5 = pIVar3[(int)i].out_opcode_;
      }
      if (((((uVar5 & 7) == 6) && (0 < q->maxmark_)) && (i == pPVar2->start_unanchored_)) &&
         (i != pPVar2->start_)) {
        iVar6 = (int)uVar7;
        uVar7 = (ulong)(iVar6 + 1);
        piVar1[iVar6] = -1;
        goto LAB_01ec8a89;
      }
      break;
    case 4:
      if ((uVar5 & 8) == 0) {
        uVar7 = (ulong)(iVar6 + 1);
        piVar1[iVar6] = i + 1;
      }
      if ((pIVar3[(int)i].field_1.out1_ & ~flag) != 0) goto LAB_01ec89a9;
LAB_01ec8a89:
      uVar5 = pIVar3[(int)i].out_opcode_;
    }
    i = uVar5 >> 4;
  } while( true );
switchD_01ec8a0e_caseD_2:
  i = i + ((uVar5 & 8) >> 3 ^ 1);
  if ((uVar5 & 8) != 0) goto LAB_01ec89a9;
  goto LAB_01ec89bc;
}

Assistant:

void DFA::AddToQueue(Workq* q, int id, uint32_t flag) {

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   one entry per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  // When using marks, we also added nmark == prog_->size().
  // (Otherwise, nmark == 0.)
  int* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = id;
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    id = stk[--nstk];

  Loop:
    if (id == Mark) {
      q->mark();
      continue;
    }

    if (id == 0)
      continue;

    // If ip is already on the queue, nothing to do.
    // Otherwise add it.  We don't actually keep all the
    // ones that get added, but adding all of them here
    // increases the likelihood of q->contains(id),
    // reducing the amount of duplicated work.
    if (q->contains(id))
      continue;
    q->insert_new(id);

    // Process instruction.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstByteRange:  // just save these on the queue
      case kInstMatch:
        if (ip->last())
          break;
        id = id+1;
        goto Loop;

      case kInstCapture:    // DFA treats captures as no-ops.
      case kInstNop:
        if (!ip->last())
          stk[nstk++] = id+1;

        // If this instruction is the [00-FF]* loop at the beginning of
        // a leftmost-longest unanchored search, separate with a Mark so
        // that future threads (which will start farther to the right in
        // the input string) are lower priority than current threads.
        if (ip->opcode() == kInstNop && q->maxmark() > 0 &&
            id == prog_->start_unanchored() && id != prog_->start())
          stk[nstk++] = Mark;
        id = ip->out();
        goto Loop;

      case kInstAltMatch:
        DCHECK(!ip->last());
        id = id+1;
        goto Loop;

      case kInstEmptyWidth:
        if (!ip->last())
          stk[nstk++] = id+1;

        // Continue on if we have all the right flag bits.
        if (ip->empty() & ~flag)
          break;
        id = ip->out();
        goto Loop;
    }
  }
}